

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O1

void __thiscall
duckdb::ClientContext::LogQueryInternal
          (ClientContext *this,ClientContextLock *param_1,string *query)

{
  pointer pCVar1;
  pointer pBVar2;
  unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>,_true> *this_00;
  
  this_00 = &this->client_data;
  pCVar1 = unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>,_true>::operator->
                     (this_00);
  if ((pCVar1->log_query_writer).
      super_unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::BufferedFileWriter_*,_std::default_delete<duckdb::BufferedFileWriter>_>
      .super__Head_base<0UL,_duckdb::BufferedFileWriter_*,_false>._M_head_impl !=
      (BufferedFileWriter *)0x0) {
    pCVar1 = unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>,_true>::
             operator->(this_00);
    pBVar2 = unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
             ::operator->(&pCVar1->log_query_writer);
    (**(pBVar2->super_WriteStream)._vptr_WriteStream)
              (pBVar2,(query->_M_dataplus)._M_p,query->_M_string_length);
    pCVar1 = unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>,_true>::
             operator->(this_00);
    pBVar2 = unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
             ::operator->(&pCVar1->log_query_writer);
    (**(pBVar2->super_WriteStream)._vptr_WriteStream)(pBVar2,anon_var_dwarf_63b5899 + 8,1);
    pCVar1 = unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>,_true>::
             operator->(this_00);
    pBVar2 = unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
             ::operator->(&pCVar1->log_query_writer);
    BufferedFileWriter::Flush(pBVar2);
    pCVar1 = unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>,_true>::
             operator->(this_00);
    pBVar2 = unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
             ::operator->(&pCVar1->log_query_writer);
    BufferedFileWriter::Sync(pBVar2);
    return;
  }
  return;
}

Assistant:

void ClientContext::LogQueryInternal(ClientContextLock &, const string &query) {
	if (!client_data->log_query_writer) {
#ifdef DUCKDB_FORCE_QUERY_LOG
		try {
			string log_path(DUCKDB_FORCE_QUERY_LOG);
			client_data->log_query_writer =
			    make_uniq<BufferedFileWriter>(FileSystem::GetFileSystem(*this), log_path,
			                                  BufferedFileWriter::DEFAULT_OPEN_FLAGS, client_data->file_opener.get());
		} catch (...) {
			return;
		}
#else
		return;
#endif
	}
	// log query path is set: log the query
	client_data->log_query_writer->WriteData(const_data_ptr_cast(query.c_str()), query.size());
	client_data->log_query_writer->WriteData(const_data_ptr_cast("\n"), 1);
	client_data->log_query_writer->Flush();
	client_data->log_query_writer->Sync();
}